

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

void __thiscall
IssuingDistributionPoint::Encode
          (IssuingDistributionPoint *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t *cbUsed_00;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  uchar *puVar3;
  undefined1 auStack_58 [8];
  EncodeHelper eh;
  
  cbUsed_00 = &eh.cbNeeded;
  auStack_58 = (undefined1  [8])0x0;
  eh.offset = 0;
  eh.cbNeeded = 0;
  eh.cbCurrent = (size_t)cbUsed;
  iVar1 = (**(this->super_ExtensionBase).super_DerBase._vptr_DerBase)();
  EncodeHelper::Init((EncodeHelper *)auStack_58,CONCAT44(extraout_var,iVar1),pOut,cbOut,'0',
                     (this->super_ExtensionBase).super_DerBase.cbData);
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<DistributionPointName,_(unsigned_char)'\xa0',_(OptionType)0>::Encode
            (&this->distributionPoint,puVar3,sVar2,cbUsed_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa1',_(OptionType)0>::Encode
            (&this->onlyContainsUserCerts,puVar3,sVar2,cbUsed_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa2',_(OptionType)0>::Encode
            (&this->onlyContainsCACerts,puVar3,sVar2,cbUsed_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<BitString,_(unsigned_char)'\xa3',_(OptionType)0>::Encode
            (&this->onlySomeReasons,puVar3,sVar2,cbUsed_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::Encode
            (&this->indirectCRL,puVar3,sVar2,cbUsed_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa5',_(OptionType)0>::Encode
            (&this->onlyContainsAttributeCerts,puVar3,sVar2,&eh.cbNeeded);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  EncodeHelper::CheckExit((EncodeHelper *)auStack_58);
  *(undefined1 (*) [8])eh.cbCurrent = auStack_58;
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
    {
        EncodeHelper eh(cbUsed);

        eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);
        
        distributionPoint.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsUserCerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsCACerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlySomeReasons.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        indirectCRL.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsAttributeCerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
		eh.Finalize();
    }